

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

char * __thiscall
sentencepiece::ModelProto_SentencePiece::_InternalParse
          (ModelProto_SentencePiece *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  bool bVar5;
  string *s;
  uint uVar6;
  char cVar7;
  uint res;
  uint32 res32;
  void *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *p;
  uint uVar9;
  char cVar10;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_unsigned_long> pVar12;
  float *local_50;
  InternalMetadata *local_48;
  ExtensionSet *local_40;
  ArenaStringPtr *local_38;
  
  local_48 = &(this->super_MessageLite)._internal_metadata_;
  local_38 = &this->piece_;
  local_40 = &this->_extensions_;
  uVar9 = 0;
  local_50 = (float *)ptr;
  do {
    bVar5 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
    if (bVar5) goto LAB_001b96b4;
    bVar1 = *(byte *)local_50;
    res = (uint)bVar1;
    p = (float *)((long)local_50 + 1);
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
      if ((char)*(byte *)p < '\0') {
        pVar11 = google::protobuf::internal::ReadTagFallback((char *)local_50,res);
        p = (float *)pVar11.first;
        res = pVar11.second;
      }
      else {
        p = (float *)((long)local_50 + 2);
      }
    }
    cVar10 = '\x04';
    local_50 = p;
    if (p != (float *)0x0) {
      uVar6 = res >> 3;
      cVar7 = (char)res;
      if (uVar6 == 3) {
        if (cVar7 != '\x18') goto LAB_001b95b9;
        bVar1 = *(byte *)p;
        auVar4._8_8_ = (long)(char)bVar1;
        auVar4._0_8_ = (byte *)((long)p + 1);
        auVar3 = auVar4._0_12_;
        if ((long)(char)bVar1 < 0) {
          bVar2 = *(byte *)((long)p + 1);
          res32 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar12 = google::protobuf::internal::VarintParseSlow64((char *)p,res32);
            auVar3 = pVar12._0_12_;
          }
          else {
            auVar3._8_4_ = res32;
            auVar3._0_8_ = (byte *)((long)p + 2);
          }
        }
        local_50 = auVar3._0_8_;
        if (local_50 != (float *)0x0) {
          if (auVar3._8_4_ - 1U < 6) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
            this->type_ = auVar3._8_4_;
          }
          else {
            _InternalParse();
          }
          goto LAB_001b9666;
        }
      }
      else {
        if (uVar6 == 2) {
          if (cVar7 == '\x15') {
            uVar9 = 2;
            this->score_ = *p;
            local_50 = p + 1;
LAB_001b9666:
            cVar10 = '\x02';
            goto LAB_001b966c;
          }
LAB_001b95b9:
          if (res == 0 || (res & 7) == 4) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
            cVar10 = '\a';
            goto LAB_001b966c;
          }
          if (res < 0x640) {
            if (((ulong)local_48->ptr_ & 1) == 0) {
              unknown = google::protobuf::internal::InternalMetadata::
                        mutable_unknown_fields_slow<std::__cxx11::string>(local_48);
            }
            else {
              unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (((ulong)local_48->ptr_ & 0xfffffffffffffffe) + 8);
            }
            local_50 = (float *)google::protobuf::internal::UnknownFieldParse
                                          (res,unknown,(char *)local_50,ctx);
          }
          else {
            local_50 = (float *)google::protobuf::internal::ExtensionSet::ParseField
                                          (local_40,(ulong)res,(char *)p,
                                           (MessageLite *)
                                           _ModelProto_SentencePiece_default_instance_,local_48,ctx)
            ;
          }
        }
        else {
          if ((uVar6 != 1) || (cVar7 != '\n')) goto LAB_001b95b9;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pvVar8 = (this->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pvVar8 & 1) != 0) {
            pvVar8 = *(void **)((ulong)pvVar8 & 0xfffffffffffffffe);
          }
          s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(local_38,pvVar8);
          local_50 = (float *)google::protobuf::internal::InlineGreedyStringParser
                                        (s,(char *)local_50,ctx);
        }
        cVar10 = (local_50 == (float *)0x0) * '\x02' + '\x02';
      }
    }
LAB_001b966c:
  } while (cVar10 == '\x02');
  if (cVar10 == '\x04') {
    local_50 = (float *)0x0;
  }
LAB_001b96b4:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar9;
  return (char *)local_50;
}

Assistant:

const char* ModelProto_SentencePiece::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string piece = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_piece();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional float score = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 21)) {
          _Internal::set_has_score(&has_bits);
          score_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.ModelProto.SentencePiece.Type type = 3 [default = NORMAL];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::sentencepiece::ModelProto_SentencePiece_Type_IsValid(val))) {
            _internal_set_type(static_cast<::sentencepiece::ModelProto_SentencePiece_Type>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(3, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}